

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triadic.h
# Opt level: O3

TriangleInfo * betterWedgeEnumerator(TriangleInfo *__return_storage_ptr__,CGraph *gout)

{
  long *plVar1;
  long lVar2;
  EdgeIdx *pEVar3;
  long lVar4;
  long lVar5;
  Count CVar6;
  long lVar7;
  long lVar8;
  
  __return_storage_ptr__->total = 0;
  lVar7 = gout->nVertices;
  if (lVar7 < 1) {
    CVar6 = 0;
  }
  else {
    pEVar3 = gout->offsets;
    lVar8 = 0;
    CVar6 = 0;
    do {
      plVar1 = pEVar3 + lVar8;
      lVar2 = pEVar3[lVar8 + 1];
      lVar8 = lVar8 + 1;
      lVar4 = *plVar1;
      if (*plVar1 < lVar2) {
        do {
          lVar5 = lVar4 + 1;
          lVar7 = lVar5;
          if (lVar5 < lVar2) {
            do {
              lVar2 = Escape::CGraph::getEdgeCount(gout,gout->nbors[lVar4],gout->nbors[lVar7]);
              if (lVar2 == -1) {
                lVar2 = 0;
              }
              CVar6 = CVar6 + lVar2;
              lVar7 = lVar7 + 1;
              pEVar3 = gout->offsets;
              lVar2 = pEVar3[lVar8];
            } while (lVar7 < lVar2);
          }
          else {
            lVar2 = pEVar3[lVar8];
          }
          lVar4 = lVar5;
        } while (lVar5 < lVar2);
        lVar7 = gout->nVertices;
      }
    } while (lVar8 < lVar7);
  }
  __return_storage_ptr__->total = CVar6;
  return __return_storage_ptr__;
}

Assistant:

TriangleInfo betterWedgeEnumerator(CGraph *gout) {
    TriangleInfo ret;   // output
    ret.total = 0;      // initialize outout

    // We do not need per vertex and per edge information. So commenting out those parts.
    // If you need such information, uncomment them.

//    ret.perVertex = new EdgeIdx[gout->nVertices + 1];
//    ret.perEdge = new EdgeIdx[gout->nEdges + 1];
//
//    for (VertexIdx i = 0; i < gout->nVertices; ++i)
//        ret.perVertex[i] = 0;
//
//    for (EdgeIdx j = 0; j < gout->nEdges; ++j)
//        ret.perEdge[j] = 0;

    VertexIdx end1, end2;
    EdgeIdx loc;

    for (VertexIdx i = 0; i < gout->nVertices; ++i) // loop over vertices
        for (EdgeIdx j = gout->offsets[i]; j < gout->offsets[i + 1]; ++j)   // loop over neighbor of i
            for (EdgeIdx k = j + 1; k < gout->offsets[i + 1]; ++k)         // loop over another neighbor of i
            {
                end1 = gout->nbors[j];     // we are now looking at wedge (i, end1, end2), centered at i
                end2 = gout->nbors[k];

                // note that end1 < end2 because of the labeled ordering

                //loc = gout->getEdgeBinary(end1, end2);
                loc = gout->getEdgeCount(end1, end2);
                if (loc != -1)        // (end1, end2) is present
                {
                    //ret.total++;       // found a triangle! So update total.
                    ret.total += loc;
//                    ret.perVertex[i]++; // update all per vertex counts
//                    ret.perVertex[end1]++;
//                    ret.perVertex[end2]++;
//
//                    ret.perEdge[j]++;  // update all per edge counts. Note that location used is same as position in g->nbors
//                    ret.perEdge[k]++;
//                    ret.perEdge[loc]++;
                }
            }

    return ret;
}